

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  MatrixCaseUtils local_ec [12];
  MatrixCaseUtils local_e0 [12];
  tcu local_d4 [12];
  VecAccess<float,_4,_3> local_c8;
  MatrixCaseUtils local_b0 [36];
  Matrix<float,_3,_3> local_8c;
  MatrixCaseUtils local_68 [36];
  Matrix<float,_3,_3> local_44;
  
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)local_68,(Matrix<float,_3,_3> *)s_constInMat3);
  decrement<float,3,3>(&local_44,local_68,mat);
  reduceToVec3(local_e0,&local_44);
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)local_b0,(Matrix<float,_3,_3> *)s_constInMat3);
  decrement<float,3,3>(&local_8c,local_b0,mat_00);
  reduceToVec3(local_ec,&local_8c);
  tcu::operator+(local_d4,(Vector<float,_3> *)local_e0,(Vector<float,_3> *)local_ec);
  local_c8.m_vector = &evalCtx->color;
  local_c8.m_index[0] = 0;
  local_c8.m_index[1] = 1;
  local_c8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_c8,(Vector<float,_3> *)local_d4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}